

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtr_mgr.c
# Opt level: O2

void rtr_mgr_close_less_preferable_groups
               (rtr_socket *sock,rtr_mgr_config *config,rtr_mgr_group *group)

{
  long lVar1;
  rtr_mgr_group *group_00;
  uint j;
  ulong uVar2;
  tommy_list ptVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_rdlock((pthread_rwlock_t *)&config->mutex);
  ptVar3 = (tommy_list)config->groups;
  while (ptVar3 = ptVar3->next, ptVar3 != (tommy_list)0x0) {
    group_00 = *(rtr_mgr_group **)((long)ptVar3->data + 0x20);
    if (((group_00 != group) && (group_00->status != RTR_MGR_CLOSED)) &&
       (group->preference < group_00->preference)) {
      for (uVar2 = 0; uVar2 < group_00->sockets_len; uVar2 = uVar2 + 1) {
        rtr_stop(group_00->sockets[uVar2]);
      }
      set_status(config,group_00,RTR_MGR_CLOSED,sock);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_rwlock_unlock((pthread_rwlock_t *)&config->mutex);
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void rtr_mgr_close_less_preferable_groups(const struct rtr_socket *sock, struct rtr_mgr_config *config,
						 struct rtr_mgr_group *group)
{
	pthread_rwlock_rdlock(&config->mutex);
	tommy_node *node = tommy_list_head(&config->groups->list);

	while (node) {
		struct rtr_mgr_group_node *group_node = node->data;
		struct rtr_mgr_group *current_group = group_node->group;

		if ((current_group->status != RTR_MGR_CLOSED) && (current_group != group) &&
		    (current_group->preference > group->preference)) {
			for (unsigned int j = 0; j < current_group->sockets_len; j++)
				rtr_stop(current_group->sockets[j]);
			set_status(config, current_group, RTR_MGR_CLOSED, sock);
		}
		node = node->next;
	}
	pthread_rwlock_unlock(&config->mutex);
}